

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DefaultRowEst(Index *pIdx)

{
  ushort uVar1;
  short *psVar2;
  short sVar3;
  ulong uVar4;
  short sVar5;
  ulong uVar6;
  ushort uVar7;
  
  psVar2 = pIdx->aiRowLogEst;
  uVar1 = pIdx->nKeyCol;
  uVar7 = uVar1;
  if (4 < uVar1) {
    uVar7 = 5;
  }
  sVar3 = (short)*(undefined4 *)&pIdx->pTable->nRowLogEst;
  sVar5 = 0x21;
  if (0x21 < sVar3) {
    sVar5 = sVar3;
  }
  *psVar2 = sVar5;
  memcpy(psVar2 + 1,&DAT_0018e78e,(ulong)(ushort)(uVar7 * 2));
  uVar4 = (ulong)pIdx->nKeyCol;
  if (uVar7 < pIdx->nKeyCol) {
    uVar7 = 5;
    if (uVar1 < 5) {
      uVar7 = uVar1;
    }
    uVar6 = (ulong)uVar7;
    do {
      psVar2[uVar6 + 1] = 0x17;
      uVar6 = uVar6 + 1;
      uVar4 = (ulong)pIdx->nKeyCol;
    } while (uVar6 < uVar4);
  }
  if (pIdx->onError != '\0') {
    psVar2[uVar4] = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DefaultRowEst(Index *pIdx){
  /*                10,  9,  8,  7,  6 */
  LogEst aVal[] = { 33, 32, 30, 28, 26 };
  LogEst *a = pIdx->aiRowLogEst;
  int nCopy = MIN(ArraySize(aVal), pIdx->nKeyCol);
  int i;

  /* Set the first entry (number of rows in the index) to the estimated 
  ** number of rows in the table. Or 10, if the estimated number of rows 
  ** in the table is less than that.  */
  a[0] = pIdx->pTable->nRowLogEst;
  if( a[0]<33 ) a[0] = 33;        assert( 33==sqlite3LogEst(10) );

  /* Estimate that a[1] is 10, a[2] is 9, a[3] is 8, a[4] is 7, a[5] is
  ** 6 and each subsequent value (if any) is 5.  */
  memcpy(&a[1], aVal, nCopy*sizeof(LogEst));
  for(i=nCopy+1; i<=pIdx->nKeyCol; i++){
    a[i] = 23;                    assert( 23==sqlite3LogEst(5) );
  }

  assert( 0==sqlite3LogEst(1) );
  if( IsUniqueIndex(pIdx) ) a[pIdx->nKeyCol] = 0;
}